

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> * __thiscall
QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
::operator[](QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
             *this,QAbstractItemView **key)

{
  vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *pvVar1;
  long in_FS_OFFSET;
  QAbstractItemView **in_stack_ffffffffffffffb8;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  pvVar1 = iterator::operator*((iterator *)0x867cd3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pvVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }